

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_wrapper.cpp
# Opt level: O0

void __thiscall YAML::ostream_wrapper::update_pos(ostream_wrapper *this,char ch)

{
  char ch_local;
  ostream_wrapper *this_local;
  
  this->m_pos = this->m_pos + 1;
  this->m_col = this->m_col + 1;
  if (ch == '\n') {
    this->m_row = this->m_row + 1;
    this->m_col = 0;
    this->m_comment = false;
  }
  return;
}

Assistant:

void ostream_wrapper::update_pos(char ch) {
  m_pos++;
  m_col++;

  if (ch == '\n') {
    m_row++;
    m_col = 0;
    m_comment = false;
  }
}